

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brdf_plot.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
brdf_plot::get_image_data
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          brdf_plot *this)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  vec3 float_color_00;
  ivec3 iVar4;
  int index;
  ivec3 color;
  anon_union_8_3_e2189aaa_for_vec<2,_float,_(glm::precision)0>_3 local_50;
  undefined8 local_48;
  vec3 float_color;
  float dx;
  int x;
  float dy;
  int y;
  brdf_plot *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *image_data;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (__return_storage_ptr__,(long)(this->_size * this->_size * 3));
  for (x = 0; x < this->_size; x = x + 1) {
    iVar1 = this->_size;
    for (float_color.field_0.field_0.z = 0.0; (int)float_color.field_0.field_0.z < this->_size;
        float_color.field_0.field_0.z = (float)((int)float_color.field_0.field_0.z + 1)) {
      float_color.field_0.field_0.y =
           ((float)(int)float_color.field_0.field_0.z + 0.5) / (float)this->_size;
      glm::vec<2,_float,_(glm::precision)0>::vec
                ((vec<2,_float,_(glm::precision)0> *)&local_50.field_0,float_color.field_0.field_0.y
                 ,1.0 - ((float)x + 0.5) / (float)iVar1);
      float_color_00 = get_pixel_color(this,(vec2)local_50.field_0);
      float_color.field_0.field_0.x = (float)float_color_00.field_0._8_4_;
      local_48 = float_color_00.field_0._0_8_;
      iVar4 = get_8bit_color(this,float_color_00);
      iVar2 = (x * this->_size + (int)float_color.field_0.field_0.z) * 3;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,(long)iVar2);
      *pvVar3 = iVar4.field_0._0_1_;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,(long)(iVar2 + 1));
      *pvVar3 = iVar4.field_0._4_1_;
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,(long)(iVar2 + 2));
      *pvVar3 = iVar4.field_0._8_1_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> brdf_plot::get_image_data()
{
  std::vector<unsigned char> image_data;
  image_data.resize(3 * _size * _size);

  for (auto y = 0; y < _size; ++y)
  {
    float dy = 1.0f - (static_cast<float>(y + 0.5f) / _size);

    for (auto x = 0; x < _size; ++x)
    {
      float dx = static_cast<float>(x + 0.5f) / _size;

      auto float_color = get_pixel_color({dx, dy});
      auto color = get_8bit_color(float_color);

      auto index = 3 * (y * _size + x);
      image_data[index + 0] = static_cast<unsigned char>(color.r);
      image_data[index + 1] = static_cast<unsigned char>(color.g);
      image_data[index + 2] = static_cast<unsigned char>(color.b);
    }
  }

  return image_data;
}